

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O3

vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_> * __thiscall
dg::vr::StructureAnalyzer::getCallRelationsFor(StructureAnalyzer *this,Instruction *inst)

{
  mapped_type *pmVar1;
  Function *function;
  key_type local_10;
  
  local_10 = (key_type)llvm::Instruction::getFunction();
  pmVar1 = std::
           map<const_llvm::Function_*,_std::vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_std::vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>_>_>_>
           ::at((map<const_llvm::Function_*,_std::vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_std::vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>_>_>_>
                 *)(this + 0xd0),&local_10);
  return pmVar1;
}

Assistant:

const std::vector<CallRelation> &
StructureAnalyzer::getCallRelationsFor(const llvm::Instruction *inst) const {
#if LLVM_VERSION_MAJOR == 3 && LLVM_VERSION_MINOR <= 7
    const llvm::Function *function = inst->getParent()->getParent();
#else
    const llvm::Function *function = inst->getFunction();
#endif
    assert(function);
    return callRelationsMap.at(function);
}